

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O3

Response Response::ok(void)

{
  value_t t;
  json_value jVar1;
  reference pvVar2;
  json_value extraout_RDX;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  *in_RDI;
  Response RVar3;
  undefined1 local_48 [8];
  json_value local_40;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ok","");
  Response((Response *)in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_48[0] = null;
  local_40.object = (object_t *)0x0;
  nlohmann::detail::
  to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[3],_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_48,(char (*) [3])"ok");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(in_RDI,"result");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"status");
  t = pvVar2->m_type;
  pvVar2->m_type = local_48[0];
  jVar1 = pvVar2->m_value;
  (pvVar2->m_value).object = (object_t *)local_40;
  local_48[0] = t;
  local_40 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_48 + 8),t);
  RVar3.content.m_value.object = extraout_RDX.object;
  RVar3.content._0_8_ = in_RDI;
  return (Response)RVar3.content;
}

Assistant:

Response Response::ok() {
    Response r("ok");
    r.content["result"]["status"] = "ok";
    return r;
}